

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_Material::Internal_ReadV5(ON_Material *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ON_UUID *pOVar4;
  wchar_t *component_name;
  ON_Texture *object;
  byte local_a7;
  ON_wString local_70;
  ON_wString obsolete_flamingo_library;
  ON__INT32 local_60;
  int trc;
  int count;
  int i;
  int texminver;
  int texmajver;
  ON_wString local_40;
  ON_wString material_name;
  int material_index;
  ON_UUID material_id;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_Material *this_local;
  
  iStack_1c = 0;
  material_id.Data4[4] = '\0';
  material_id.Data4[5] = '\0';
  material_id.Data4[6] = '\0';
  material_id.Data4[7] = '\0';
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  material_id.Data4[3] =
       ON_BinaryArchive::Read3dmChunkVersion
                 (file,&stack0xffffffffffffffe4,(int *)(material_id.Data4 + 4));
  if (!(bool)material_id.Data4[3]) goto LAB_006bc31c;
  if (iStack_1c == 1) {
    material_id.Data4[3] = Internal_ReadV3(this,_minor_version,material_id.Data4._4_4_);
    goto LAB_006bc31c;
  }
  if ((iStack_1c != 2) ||
     (material_id.Data4[3] =
           ON_BinaryArchive::BeginRead3dmChunk
                     (_minor_version,0x40008000,&stack0xffffffffffffffe4,
                      (int *)(material_id.Data4 + 4)), !(bool)material_id.Data4[3]))
  goto LAB_006bc31c;
  pOVar4 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
  material_name.m_s._4_4_ = pOVar4->Data1;
  unique0x00012004 = pOVar4->Data2;
  unique0x00012006 = pOVar4->Data3;
  material_id._0_8_ = *(undefined8 *)pOVar4->Data4;
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] =
         ON_BinaryArchive::ReadUuid(_minor_version,(ON_UUID *)((long)&material_name.m_s + 4));
  }
  if ((material_id.Data4[3] & 1) != 0) {
    ON_ModelComponent::SetId
              (&this->super_ON_ModelComponent,(ON_UUID *)((long)&material_name.m_s + 4));
  }
  material_name.m_s._0_4_ = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&material_name);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,(int)material_name.m_s);
  }
  ON_wString::ON_wString(&local_40);
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadString(_minor_version,&local_40);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    component_name = ON_wString::operator_cast_to_wchar_t_(&local_40);
    ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_plugin_id);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadColor(_minor_version,&this->m_ambient);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadColor(_minor_version,&this->m_diffuse);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadColor(_minor_version,&this->m_emission);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadColor(_minor_version,&this->m_specular);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadColor(_minor_version,&this->m_reflection);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadColor(_minor_version,&this->m_transparent);
  }
  if (((((material_id.Data4[3] & 1) != 0) &&
       (uVar2 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_minor_version), uVar2 < 0xbf9ac8a)) &&
      (iVar3 = ON_Color::Red(&this->m_transparent), iVar3 == 0x80)) &&
     ((iVar3 = ON_Color::Green(&this->m_transparent), iVar3 == 0x80 &&
      (iVar3 = ON_Color::Blue(&this->m_transparent), iVar3 == 0x80)))) {
    (this->m_transparent).field_0 = (this->m_diffuse).field_0;
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_index_of_refraction)
    ;
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_reflectivity);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_shine);
  }
  if ((material_id.Data4[3] & 1) != 0) {
    material_id.Data4[3] = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_transparency);
  }
  if ((material_id.Data4[3] & 1) == 0) {
    texminver = 2;
  }
  else {
    i = 0;
    count = 0;
    material_id.Data4[3] = ON_BinaryArchive::BeginRead3dmChunk(_minor_version,0x40008000,&i,&count);
    if ((bool)material_id.Data4[3]) {
      if (i == 1) {
        local_60 = 0;
        material_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,&local_60);
        if ((bool)material_id.Data4[3]) {
          ON_ClassArray<ON_Texture>::Reserve
                    (&(this->m_textures).super_ON_ClassArray<ON_Texture>,(long)local_60);
        }
        trc = 0;
        while( true ) {
          this_00 = _minor_version;
          local_a7 = 0;
          if (trc < local_60) {
            local_a7 = material_id.Data4[3];
          }
          if ((local_a7 & 1) == 0) break;
          object = ON_ClassArray<ON_Texture>::AppendNew
                             (&(this->m_textures).super_ON_ClassArray<ON_Texture>);
          obsolete_flamingo_library.m_s._4_4_ =
               ON_BinaryArchive::ReadObject(this_00,&object->super_ON_Object);
          if (obsolete_flamingo_library.m_s._4_4_ < 1) {
            material_id.Data4[3] = '\0';
            ON_ClassArray<ON_Texture>::Remove(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
          }
          else if (1 < obsolete_flamingo_library.m_s._4_4_) {
            ON_ClassArray<ON_Texture>::Remove(&(this->m_textures).super_ON_ClassArray<ON_Texture>);
          }
          trc = trc + 1;
        }
      }
      bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
      if (!bVar1) {
        material_id.Data4[3] = '\0';
      }
    }
    if (((material_id.Data4[3] & 1) != 0) && (0 < (int)material_id.Data4._4_4_)) {
      ON_wString::ON_wString(&local_70);
      material_id.Data4[3] = ON_BinaryArchive::ReadString(_minor_version,&local_70);
      if ((bool)material_id.Data4[3]) {
        if ((int)material_id.Data4._4_4_ < 2) {
LAB_006bc2cb:
          texminver = 0;
        }
        else {
          material_id.Data4[3] =
               ON_BinaryArchive::ReadArray(_minor_version,&this->m_material_channel);
          if ((bool)material_id.Data4[3]) {
            if ((int)material_id.Data4._4_4_ < 3) goto LAB_006bc2cb;
            material_id.Data4[3] = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bShareable);
            if ((bool)material_id.Data4[3]) {
              material_id.Data4[3] =
                   ON_BinaryArchive::ReadBool(_minor_version,&this->m_bDisableLighting);
              if ((bool)material_id.Data4[3]) {
                if ((int)material_id.Data4._4_4_ < 4) goto LAB_006bc2cb;
                material_id.Data4[3] =
                     ON_BinaryArchive::ReadBool(_minor_version,&this->m_bFresnelReflections);
                if ((bool)material_id.Data4[3]) {
                  material_id.Data4[3] =
                       ON_BinaryArchive::ReadDouble(_minor_version,&this->m_reflection_glossiness);
                  if ((bool)material_id.Data4[3]) {
                    material_id.Data4[3] =
                         ON_BinaryArchive::ReadDouble(_minor_version,&this->m_refraction_glossiness)
                    ;
                    if ((bool)material_id.Data4[3]) {
                      material_id.Data4[3] =
                           ON_BinaryArchive::ReadDouble
                                     (_minor_version,&this->m_fresnel_index_of_refraction);
                      if ((bool)material_id.Data4[3]) {
                        if (((int)material_id.Data4._4_4_ < 5) ||
                           (material_id.Data4[3] =
                                 ON_BinaryArchive::ReadUuid
                                           (_minor_version,&this->m_rdk_material_instance_id),
                           (bool)material_id.Data4[3])) {
                          if (((int)material_id.Data4._4_4_ < 6) ||
                             (material_id.Data4[3] =
                                   ON_BinaryArchive::ReadBool
                                             (_minor_version,
                                              &this->
                                               m_bUseDiffuseTextureAlphaForObjectTransparencyTexture
                                             ), (bool)material_id.Data4[3])) goto LAB_006bc2cb;
                          texminver = 2;
                        }
                        else {
                          texminver = 2;
                        }
                      }
                      else {
                        texminver = 2;
                      }
                    }
                    else {
                      texminver = 2;
                    }
                  }
                  else {
                    texminver = 2;
                  }
                }
                else {
                  texminver = 2;
                }
              }
              else {
                texminver = 2;
              }
            }
            else {
              texminver = 2;
            }
          }
          else {
            texminver = 2;
          }
        }
      }
      else {
        texminver = 2;
      }
      ON_wString::~ON_wString(&local_70);
      if (texminver != 0) goto LAB_006bc2ed;
    }
    texminver = 2;
  }
LAB_006bc2ed:
  ON_wString::~ON_wString(&local_40);
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
  if (!bVar1) {
    material_id.Data4[3] = '\0';
  }
LAB_006bc31c:
  return (bool)(material_id.Data4[3] & 1);
}

Assistant:

bool ON_Material::Internal_ReadV5( ON_BinaryArchive& file )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc)
  {
    if ( 1 == major_version )
    {
      rc = Internal_ReadV3(file,minor_version);
    }
    else if ( 2 == major_version )
    {
      // fancy V4 material
      // V4 file format

      // The chunk version 2.0 prevents old V3 IO code from attempting
      // to read this material
      rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
      if (rc)
      {
        for(;;)
        {
          ON_UUID material_id = Id();
          if ( rc ) rc = file.ReadUuid(material_id);
          if (rc) SetId(material_id);

          int material_index = Index();
          if ( rc ) rc = file.ReadInt(&material_index);
          if (rc) SetIndex(material_index);

          ON_wString material_name;
          if ( rc ) rc = file.ReadString(material_name);
          if (rc) SetName(material_name);

          if ( rc ) rc = file.ReadUuid(m_plugin_id);

          if ( rc ) rc = file.ReadColor( m_ambient );
          if ( rc ) rc = file.ReadColor( m_diffuse );
          if ( rc ) rc = file.ReadColor( m_emission );
          if ( rc ) rc = file.ReadColor( m_specular );
          if ( rc ) rc = file.ReadColor( m_reflection );
          if ( rc ) rc = file.ReadColor( m_transparent );

          if ( rc
               && file.ArchiveOpenNURBSVersion() < 200912010
               && 128 == m_transparent.Red()
               && 128 == m_transparent.Green()
               && 128 == m_transparent.Blue()
               )
          {
            // Prior to 1 Dec 2009 the ON_Material::Defaults() set
            // m_transparent to 128,128,128.  This was the wrong
            // value for the default.  This "hack" is here to
            // make it appear that the default was always white.
            m_transparent = m_diffuse;
          }

          if ( rc ) rc = file.ReadDouble( &m_index_of_refraction );
          if ( rc ) rc = file.ReadDouble( &m_reflectivity );
          if ( rc ) rc = file.ReadDouble( &m_shine );
          if ( rc ) rc = file.ReadDouble( &m_transparency );

          if ( !rc )
            break;

          // array of textures read in a way that user data persists
          int texmajver = 0;
          int texminver = 0;
          rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&texmajver,&texminver);
          if (rc)
          {
            if ( 1 == texmajver )
            {
              int i, count = 0;
              rc = file.ReadInt(&count);
              if (rc) m_textures.Reserve(count);
              for ( i = 0; i < count && rc; i++ )
              {
                int trc = file.ReadObject(m_textures.AppendNew());
                if (trc <= 0)
                {
                  // http://mcneel.myjetbrains.com/youtrack/issue/RH-30204
                  // Part of fixing crash reading corrupt file sem2observe copy.3dm
                  rc = false;
                  m_textures.Remove();
                }
                else if ( trc > 1 )
                  m_textures.Remove();
              }
            }
            if ( !file.EndRead3dmChunk() )
              rc = false;
          }

          if ( rc && minor_version >= 1 )
          {
            ON_wString obsolete_flamingo_library;
            rc = file.ReadString(obsolete_flamingo_library);
            if ( !rc ) break;

            if ( minor_version >= 2 )
            {
              // version 1.2 field (20061113)
              rc = file.ReadArray(m_material_channel);
              if (!rc) break;

              if ( minor_version >= 3 )
              {
                // version 1.3 fields (20100917*)
                rc = file.ReadBool(&m_bShareable);
                if (!rc) break;
                rc = file.ReadBool(&m_bDisableLighting);
                if (!rc) break;
                if ( minor_version >= 4 )
                {
                  rc = file.ReadBool(&m_bFresnelReflections);
                  if (!rc) break;
                  rc = file.ReadDouble(&m_reflection_glossiness);
                  if (!rc) break;
                  rc = file.ReadDouble(&m_refraction_glossiness);
                  if (!rc) break;
                  rc = file.ReadDouble(&m_fresnel_index_of_refraction);
                  if (!rc) break;

                  if (minor_version >= 5)
                  {
                    // version 1.5 field 6.0.2014-05-16
                    rc = file.ReadUuid(m_rdk_material_instance_id);
                    if (!rc) break;
                  }

                  if (minor_version >= 6)
                  {
                    // version 1.6 field 6.0.2014-07-11
                    rc = file.ReadBool(&m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);
                    if (!rc) break;
                  }
                }
              }
            }

          }

          break;
        }
        if (!file.EndRead3dmChunk() )
          rc = false;
      }
    }
  }
  return rc;
}